

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,Model *param_2,
          Cluster *cl,vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *node_global_transform)

{
  value_type vVar1;
  aiVertexWeight *paVar2;
  undefined1 auVar3 [16];
  aiBone *this_00;
  Model *this_01;
  string *name;
  aiMatrix4x4 *__src;
  size_type sVar4;
  ulong uVar5;
  WeightArray *this_02;
  reference pvVar6;
  const_reference pvVar7;
  aiVertexWeight *local_128;
  aiVertexWeight *out_weight;
  size_t j;
  size_t cc;
  size_t index_index;
  size_t i;
  size_t c;
  WeightArray *weights;
  size_t no_index_sentinel;
  aiVertexWeight *cursor;
  string local_60;
  aiBone *local_40;
  aiBone *bone;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices_local;
  Cluster *cl_local;
  Model *param_2_local;
  vector<aiBone_*,_std::allocator<aiBone_*>_> *bones_local;
  FBXConverter *this_local;
  
  bone = (aiBone *)index_out_indices;
  index_out_indices_local = out_indices;
  out_indices_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cl;
  cl_local = (Cluster *)param_2;
  param_2_local = (Model *)bones;
  bones_local = (vector<aiBone_*,_std::allocator<aiBone_*>_> *)this;
  this_00 = (aiBone *)operator_new(0x450);
  aiBone::aiBone(this_00);
  local_40 = this_00;
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back
            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)param_2_local,&local_40);
  this_01 = Cluster::TargetNode((Cluster *)out_indices_local);
  name = FBX::Object::Name_abi_cxx11_(&this_01->super_Object);
  FixNodeName(&local_60,this,name);
  aiString::operator=(&local_40->mName,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  __src = Cluster::TransformLink((Cluster *)out_indices_local);
  memcpy(&local_40->mOffsetMatrix,__src,0x40);
  aiMatrix4x4t<float>::Inverse(&local_40->mOffsetMatrix);
  aiMatrix4x4t<float>::operator*
            ((aiMatrix4x4t<float> *)((long)&cursor + 4),&local_40->mOffsetMatrix,
             node_global_transform);
  memcpy(&local_40->mOffsetMatrix,(void *)((long)&cursor + 4),0x40);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(index_out_indices_local);
  local_40->mNumWeights = (uint)sVar4;
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(index_out_indices_local);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  no_index_sentinel = (size_t)operator_new__(uVar5);
  if (sVar4 != 0) {
    local_128 = (aiVertexWeight *)no_index_sentinel;
    do {
      aiVertexWeight::aiVertexWeight(local_128);
      local_128 = local_128 + 1;
    } while (local_128 != (aiVertexWeight *)(no_index_sentinel + sVar4 * 8));
  }
  local_40->mWeights = (aiVertexWeight *)no_index_sentinel;
  this_02 = Cluster::GetWeights((Cluster *)out_indices_local);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)bone);
  for (index_index = 0; index_index < sVar4; index_index = index_index + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)bone,index_index);
    vVar1 = *pvVar6;
    if (vVar1 != 0xffffffffffffffff) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (count_out_indices,index_index);
      paVar2 = (aiVertexWeight *)*pvVar6;
      for (out_weight = (aiVertexWeight *)0x0; out_weight < paVar2;
          out_weight = (aiVertexWeight *)((long)&out_weight->mVertexId + 1)) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (index_out_indices_local,(long)&out_weight->mVertexId + vVar1);
        *(int *)no_index_sentinel = (int)*pvVar6;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](this_02,index_index);
        *(value_type *)(no_index_sentinel + 4) = *pvVar7;
        no_index_sentinel = no_index_sentinel + 8;
      }
    }
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone*>& bones, const Model& /*model*/, const Cluster& cl,
            std::vector<size_t>& out_indices,
            std::vector<size_t>& index_out_indices,
            std::vector<size_t>& count_out_indices,
            const aiMatrix4x4& node_global_transform)
        {

            aiBone* const bone = new aiBone();
            bones.push_back(bone);

            bone->mName = FixNodeName(cl.TargetNode()->Name());

            bone->mOffsetMatrix = cl.TransformLink();
            bone->mOffsetMatrix.Inverse();

            bone->mOffsetMatrix = bone->mOffsetMatrix * node_global_transform;

            bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
            aiVertexWeight* cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

            const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
            const WeightArray& weights = cl.GetWeights();

            const size_t c = index_out_indices.size();
            for (size_t i = 0; i < c; ++i) {
                const size_t index_index = index_out_indices[i];

                if (index_index == no_index_sentinel) {
                    continue;
                }

                const size_t cc = count_out_indices[i];
                for (size_t j = 0; j < cc; ++j) {
                    aiVertexWeight& out_weight = *cursor++;

                    out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                    out_weight.mWeight = weights[i];
                }
            }
        }